

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O1

void verbalize(char *line,...)

{
  char in_AL;
  size_t sVar1;
  char *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list the_args;
  __va_list_tag local_f8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (flags.soundok != '\0') {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &the_args[0].overflow_arg_area;
    local_f8.gp_offset = 8;
    local_f8.fp_offset = 0x30;
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    sVar1 = strlen(line);
    __dest = You_buf((int)sVar1 + 3);
    __dest[0] = '\"';
    __dest[1] = '\0';
    strcat(__dest,line);
    sVar1 = strlen(__dest);
    (__dest + sVar1)[0] = '\"';
    (__dest + sVar1)[1] = '\0';
    vpline(__dest,&local_f8);
  }
  return;
}

Assistant:

void verbalize (const char *line, ...)
{
	va_list the_args;
	char *tmp;
	if (!flags.soundok) return;
	va_start(the_args, line);
	tmp = You_buf((int)strlen(line) + sizeof "\"\"");
	strcpy(tmp, "\"");
	strcat(tmp, line);
	strcat(tmp, "\"");
	vpline(tmp, the_args);
	va_end(the_args);
}